

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_variableEqualAllTestedConditionsVariant2_Test::
~Equality_variableEqualAllTestedConditionsVariant2_Test
          (Equality_variableEqualAllTestedConditionsVariant2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, variableEqualAllTestedConditionsVariant2)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    libcellml::VariablePtr v3 = libcellml::Variable::create("initialValue");
    libcellml::VariablePtr v4 = libcellml::Variable::create("initialValue");

    libcellml::UnitsPtr u1 = libcellml::Units::create("m_per_s");
    libcellml::UnitsPtr u2 = libcellml::Units::create("m_per_s");

    v1->setInitialValue(v3);
    v2->setInitialValue(v4);

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    v2->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);

    v1->setUnits(u1);
    v2->setUnits(u2);

    EXPECT_TRUE(v1->equals(v2));
    EXPECT_TRUE(v2->equals(v1));
}